

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::Inline_Array_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Inline_Array_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss
          )

{
  Type_Conversions *pTVar1;
  long lVar2;
  undefined8 *puVar3;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *puVar4;
  Boxed_Value BVar5;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> vec;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_78;
  Inline_Array_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *local_58;
  undefined1 local_50 [16];
  detail local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_78.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = t_ss[2].m_conversions.m_conversions._M_data;
  local_58 = this;
  if (pTVar1 != (Type_Conversions *)t_ss[2].m_conversions.m_saves._M_data) {
    lVar2 = (pTVar1->m_mutex)._M_impl._M_rwlock.__align;
    Catch::clara::std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
    reserve(&local_78,*(long *)(lVar2 + 0x58) - *(long *)(lVar2 + 0x50) >> 3);
    lVar2 = ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align;
    puVar4 = *(undefined8 **)(lVar2 + 0x50);
    puVar3 = *(undefined8 **)(lVar2 + 0x58);
    if (puVar4 != puVar3) {
      do {
        AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_50,
                   (Dispatch_State *)*puVar4);
        detail::clone_if_necessary
                  (local_40,(Boxed_Value *)local_50,(atomic_uint_fast32_t *)&t_ss[3].m_stack_holder,
                   in_RDX);
        Catch::clara::std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
        ::emplace_back<chaiscript::Boxed_Value>(&local_78,(Boxed_Value *)local_40);
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
        }
        puVar4 = puVar4 + 1;
      } while (puVar4 != puVar3);
    }
  }
  chaiscript::detail::
  const_var_impl<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            ((detail *)local_58,&local_78);
  Catch::clara::std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
  ~vector(&local_78);
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_58;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        try {
          std::vector<Boxed_Value> vec;
          if (!this->children.empty()) {
            vec.reserve(this->children[0]->children.size());
            for (const auto &child : this->children[0]->children) {
              vec.push_back(detail::clone_if_necessary(child->eval(t_ss), m_loc, t_ss));
            }
          }
          return const_var(std::move(vec));
        } catch (const exception::dispatch_error &) {
          throw exception::eval_error("Can not find appropriate 'clone' or copy constructor for vector elements");
        }
      }